

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O1

shared_ptr<helics::helicsCLI11App> __thiscall helics::CoreBroker::generateCLI(CoreBroker *this)

{
  App *pAVar1;
  Option *pOVar2;
  Option *pOVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  long in_RSI;
  pair<std::_Rb_tree_iterator<CLI::Option_*>,_bool> pVar5;
  shared_ptr<helics::helicsCLI11App> sVar6;
  Option *local_120;
  _Any_data local_118;
  code *local_108;
  code *pcStack_100;
  BrokerBase *local_f8;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  (this->super_Broker)._vptr_Broker = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<helics::helicsCLI11App,std::allocator<helics::helicsCLI11App>,char_const(&)[18]>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->super_BrokerBase,
             (helicsCLI11App **)this,(allocator<helics::helicsCLI11App> *)&local_120,
             (char (*) [18])"Option for Broker");
  local_f8 = &this->super_BrokerBase;
  helicsCLI11App::remove_helics_specifics((helicsCLI11App *)(this->super_Broker)._vptr_Broker);
  pAVar1 = (App *)(this->super_Broker)._vptr_Broker;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"--root","");
  local_118._8_8_ = 0;
  pcStack_100 = CLI::std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CoreBroker.cpp:2386:19)>
                ::_M_invoke;
  local_108 = CLI::std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CoreBroker.cpp:2386:19)>
              ::_M_manager;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"specify whether the broker is a root","");
  CLI::App::add_flag_callback(pAVar1,&local_50,(function<void_()> *)&local_118,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_108 != (code *)0x0) {
    (*local_108)(&local_118,&local_118,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  pAVar1 = (App *)(this->super_Broker)._vptr_Broker;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"--timemonitor","");
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,
             "specify a federate to use as the primary time monitor for logging and indicator purpose, it has no actual impact on the cosimulation"
             ,"");
  pOVar2 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (pAVar1,&local_90,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (in_RSI + 0xd98),&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  pAVar1 = (App *)(this->super_Broker)._vptr_Broker;
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"--timemonitorperiod","");
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f0,"period to display logs of times from the time monitor federate",""
            );
  pOVar3 = CLI::App::
           add_option<TimeRepresentation<count_time<9,_long>_>,_TimeRepresentation<count_time<9,_long>_>,_(CLI::detail::enabler)0>
                     (pAVar1,&local_d0,(TimeRepresentation<count_time<9,_long>_> *)(in_RSI + 0xdc0),
                      &local_f0);
  _Var4._M_pi = extraout_RDX;
  local_120 = pOVar2;
  if (pOVar2 != pOVar3) {
    pVar5 = std::
            _Rb_tree<CLI::Option*,CLI::Option*,std::_Identity<CLI::Option*>,std::less<CLI::Option*>,std::allocator<CLI::Option*>>
            ::_M_insert_unique<CLI::Option*const&>
                      ((_Rb_tree<CLI::Option*,CLI::Option*,std::_Identity<CLI::Option*>,std::less<CLI::Option*>,std::allocator<CLI::Option*>>
                        *)&pOVar3->needs_,&local_120);
    _Var4._M_pi = pVar5._8_8_;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    _Var4._M_pi = extraout_RDX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    _Var4._M_pi = extraout_RDX_01;
  }
  sVar6.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  sVar6.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<helics::helicsCLI11App>)
         sVar6.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<helicsCLI11App> CoreBroker::generateCLI()
{
    auto app = std::make_shared<helicsCLI11App>("Option for Broker");
    app->remove_helics_specifics();
    app->add_flag_callback(
        "--root", [this]() { setAsRoot(); }, "specify whether the broker is a root");
    auto* tfed = app->add_option(
        "--timemonitor",
        mTimeMonitorFederate,
        "specify a federate to use as the primary time monitor for logging and indicator purpose, it has no actual impact on the cosimulation");
    app->add_option("--timemonitorperiod",
                    mTimeMonitorPeriod,
                    "period to display logs of times from the time monitor federate")
        ->needs(tfed);
    return app;
}